

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

void re2::AppendCCRange(string *t,Rune lo,Rune hi)

{
  Rune hi_local;
  Rune lo_local;
  string *t_local;
  
  if ((lo <= hi) && (AppendCCChar(t,lo), lo < hi)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(t,"-");
    AppendCCChar(t,hi);
  }
  return;
}

Assistant:

static void AppendCCRange(std::string* t, Rune lo, Rune hi) {
  if (lo > hi)
    return;
  AppendCCChar(t, lo);
  if (lo < hi) {
    t->append("-");
    AppendCCChar(t, hi);
  }
}